

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookptravltree.h
# Opt level: O3

int __thiscall cookmem::PtrAVLTree::remove(PtrAVLTree *this,char *__filename)

{
  ulong uVar1;
  Node *pNVar2;
  short sVar3;
  Node *next;
  Node *root;
  short sVar4;
  long lVar5;
  Node *stack [65];
  long alStack_40218 [32768];
  Node *local_218;
  long alStack_210 [64];
  
  root = this->m_root;
  if (root != (Node *)0x0) {
    local_218 = root;
    uVar1 = *(ulong *)__filename;
    sVar3 = -1;
    do {
      sVar4 = sVar3;
      lVar5 = 0x10;
      if ((root->size <= uVar1) && (lVar5 = 0x18, uVar1 <= root->size)) goto LAB_00102e73;
      root = *(Node **)((long)&root->reserved + lVar5);
      alStack_210[(short)(sVar4 + 1)] = (long)root;
      sVar3 = sVar4 + 1;
    } while (root != (Node *)0x0);
    root = (Node *)alStack_210[(long)sVar3 + -1];
    if (uVar1 <= root->size) {
LAB_00102e73:
      sVar4 = sVar4 + 1;
LAB_00102e77:
      pNVar2 = root->next;
      if (pNVar2 == (Node *)0x0) {
        removeNode(this,root,&local_218,(int)sVar4);
      }
      else {
        root->next = pNVar2->next;
        root = pNVar2;
      }
      *(size_t *)__filename = root->size;
      goto LAB_00102ea2;
    }
    if (sVar3 != 0) {
      root = (Node *)alStack_210[(long)sVar4 + -1];
      if (uVar1 <= root->size) goto LAB_00102e77;
    }
  }
  root = (Node *)0x0;
LAB_00102ea2:
  return (int)root;
}

Assistant:

void*
    remove (std::size_t& size)
    {
        Node* root;
        Node* stack[sizeof(Node*) * 8 + 1];
        std::int16_t depth;

        if (m_root == nullptr)
        {
            return nullptr;
        }

        root = stack[0] = m_root;

        for (depth = 0; ; ++depth)
        {
            if (root == nullptr)
            {
                --depth;
                root = stack[depth];
                if (size > root->size)
                {
                    // check if the parent is also smaller.
                    if (depth == 0)
                    {
                        return nullptr;
                    }

                    --depth;
                    root = stack[depth];
                    if (size > root->size)
                    {
                        return nullptr;
                    }
                    break;
                }
                break;
            }

            if (size < root->size)
            {
                root = stack[depth + 1] = root->left;
                continue;
            }
            else if (size > root->size)
            {
                root = stack[depth + 1] = root->right;
                continue;
            }

            break;
        }

        // At this point, this node's size is the smallest size
        // larger than or equal to rs.size.
        if (root->next)
        {
            // This is a simple case of having SLL of similar sized nodes.
            // just remove one from the SLL.
            Node* next = root->next;
            root->next = next->next;

            size = next->size;
            return next;
        }

        removeNode (root, stack, depth);
        size = root->size;
        return root;
    }